

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O3

int run_test_spawn_setuid_fails(void)

{
  __uid_t _Var1;
  int iVar2;
  uint uVar3;
  int extraout_EAX;
  uv_process_options_t *puVar4;
  undefined8 uVar5;
  int *piVar6;
  uv_process_options_t *puVar7;
  uv_buf_t *buf;
  uv_process_options_t *unaff_RBX;
  undefined1 *nread;
  uv_stream_t *tcp;
  uv_process_options_t *unaff_R14;
  uv_process_options_t *unaff_R15;
  undefined1 auVar8 [16];
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_918 [48];
  uv_handle_t *apuStack_8e8 [11];
  uv_loop_t *puStack_890;
  undefined8 auStack_728 [29];
  uv_stdio_container_t uStack_640;
  undefined4 uStack_630;
  undefined4 uStack_620;
  uv_process_options_t *puStack_608;
  long lStack_5d0;
  uint uStack_5c8;
  int iStack_5c4;
  undefined1 auStack_5c0 [16];
  undefined8 uStack_5b0;
  undefined2 uStack_5a8;
  uv_stdio_container_t uStack_5a0;
  long alStack_588 [25];
  long alStack_4c0 [25];
  long alStack_3f8 [29];
  undefined1 auStack_310 [88];
  uint uStack_2b8;
  uv_process_options_t *puStack_150;
  uv_process_options_t *puStack_148;
  uv_process_options_t *puStack_140;
  long lStack_138;
  long lStack_130;
  uv_process_options_t *puStack_128;
  char cStack_111;
  long lStack_110;
  long lStack_108;
  uv_process_options_t *puStack_100;
  uv_process_options_t *puStack_f8;
  uv_process_options_t *apuStack_f0 [2];
  uv_process_options_t *puStack_e0;
  cpu_set_t cStack_d8;
  uv_process_options_t *puStack_50;
  
  _Var1 = getuid();
  if (_Var1 == 0) {
    puVar4 = (uv_process_options_t *)getpwnam("nobody");
    if (puVar4 == (uv_process_options_t *)0x0) goto LAB_001c24e5;
    iVar2 = setgid(*(__gid_t *)((long)&puVar4->args + 4));
    unaff_RBX = puVar4;
    if (iVar2 != 0) goto LAB_001c24ea;
    iVar2 = setuid(*(__uid_t *)&puVar4->args);
    if (iVar2 == 0) goto LAB_001c23ae;
  }
  else {
LAB_001c23ae:
    init_process_options("spawn_helper1",fail_cb);
    unaff_RBX = &options;
    options.uid = 0;
    options.flags._0_1_ = (byte)options.flags | 0x75;
    uVar5 = uv_default_loop();
    iVar2 = uv_spawn(uVar5,&process,&options);
    if (iVar2 == -1) {
      uVar5 = uv_default_loop();
      iVar2 = uv_run(uVar5,0);
      if (iVar2 != 0) goto LAB_001c24be;
      if (close_cb_called != 0) goto LAB_001c24cb;
      unaff_RBX = (uv_process_options_t *)uv_default_loop();
      uv_walk(unaff_RBX,close_walk_cb,0);
      uv_run(unaff_RBX,0);
      uVar5 = uv_default_loop();
      iVar2 = uv_loop_close(uVar5);
      if (iVar2 == 0) {
        uv_library_shutdown();
        return 0;
      }
    }
    else {
      run_test_spawn_setuid_fails_cold_3();
LAB_001c24be:
      run_test_spawn_setuid_fails_cold_4();
LAB_001c24cb:
      run_test_spawn_setuid_fails_cold_5();
    }
    run_test_spawn_setuid_fails_cold_6();
LAB_001c24e5:
    run_test_spawn_setuid_fails_cold_7();
LAB_001c24ea:
    run_test_spawn_setuid_fails_cold_1();
  }
  run_test_spawn_setuid_fails_cold_2();
  _Var1 = getuid();
  if (_Var1 == 0) {
    puVar4 = (uv_process_options_t *)getpwnam("nobody");
    if (puVar4 == (uv_process_options_t *)0x0) goto LAB_001c26ad;
    iVar2 = setgid(*(__gid_t *)((long)&puVar4->args + 4));
    unaff_RBX = puVar4;
    if (iVar2 != 0) goto LAB_001c26b2;
    iVar2 = setuid(*(__uid_t *)&puVar4->args);
    if (iVar2 == 0) goto LAB_001c2576;
  }
  else {
LAB_001c2576:
    init_process_options("spawn_helper1",fail_cb);
    unaff_RBX = &options;
    options.flags._0_1_ = (byte)options.flags | 2;
    options.gid = 0;
    uVar5 = uv_default_loop();
    iVar2 = uv_spawn(uVar5,&process,&options);
    if (iVar2 == -1) {
      uVar5 = uv_default_loop();
      iVar2 = uv_run(uVar5,0);
      if (iVar2 != 0) goto LAB_001c2686;
      if (close_cb_called != 0) goto LAB_001c2693;
      unaff_RBX = (uv_process_options_t *)uv_default_loop();
      uv_walk(unaff_RBX,close_walk_cb,0);
      uv_run(unaff_RBX,0);
      uVar5 = uv_default_loop();
      iVar2 = uv_loop_close(uVar5);
      if (iVar2 == 0) {
        uv_library_shutdown();
        return 0;
      }
    }
    else {
      run_test_spawn_setgid_fails_cold_3();
LAB_001c2686:
      run_test_spawn_setgid_fails_cold_4();
LAB_001c2693:
      run_test_spawn_setgid_fails_cold_5();
    }
    run_test_spawn_setgid_fails_cold_6();
LAB_001c26ad:
    run_test_spawn_setgid_fails_cold_7();
LAB_001c26b2:
    run_test_spawn_setgid_fails_cold_1();
  }
  run_test_spawn_setgid_fails_cold_2();
  puStack_100 = (uv_process_options_t *)0x1c26df;
  puStack_50 = unaff_RBX;
  uVar3 = uv_cpumask_size();
  if ((int)uVar3 < 1) {
    puStack_100 = (uv_process_options_t *)0x1c28c8;
    run_test_spawn_affinity_cold_1();
LAB_001c28c8:
    puStack_100 = (uv_process_options_t *)0x1c28d5;
    run_test_spawn_affinity_cold_2();
LAB_001c28d5:
    puStack_100 = (uv_process_options_t *)0x1c28e2;
    run_test_spawn_affinity_cold_3();
    puVar4 = unaff_RBX;
LAB_001c28e2:
    puVar7 = unaff_R14;
    puStack_100 = (uv_process_options_t *)0x1c28e7;
    run_test_spawn_affinity_cold_9();
LAB_001c28e7:
    puStack_100 = (uv_process_options_t *)0x1c28ec;
    run_test_spawn_affinity_cold_4();
LAB_001c28ec:
    puStack_100 = (uv_process_options_t *)0x1c28f1;
    run_test_spawn_affinity_cold_5();
LAB_001c28f1:
    puStack_100 = (uv_process_options_t *)0x1c28f6;
    run_test_spawn_affinity_cold_6();
LAB_001c28f6:
    puStack_100 = (uv_process_options_t *)0x1c28fb;
    run_test_spawn_affinity_cold_7();
  }
  else {
    unaff_RBX = (uv_process_options_t *)(ulong)uVar3;
    cStack_d8.__bits[0xe] = 0;
    cStack_d8.__bits[0xf] = 0;
    cStack_d8.__bits[0xc] = 0;
    cStack_d8.__bits[0xd] = 0;
    cStack_d8.__bits[10] = 0;
    cStack_d8.__bits[0xb] = 0;
    cStack_d8.__bits[8] = 0;
    cStack_d8.__bits[9] = 0;
    cStack_d8.__bits[6] = 0;
    cStack_d8.__bits[7] = 0;
    cStack_d8.__bits[4] = 0;
    cStack_d8.__bits[5] = 0;
    cStack_d8.__bits[2] = 0;
    cStack_d8.__bits[3] = 0;
    cStack_d8.__bits[0] = 0;
    cStack_d8.__bits[1] = 0;
    unaff_R14 = (uv_process_options_t *)0x0;
    puStack_100 = (uv_process_options_t *)0x1c271f;
    iVar2 = sched_getaffinity(0,0x80,&cStack_d8);
    if (iVar2 != 0) {
      puStack_100 = (uv_process_options_t *)0x1c2728;
      piVar6 = __errno_location();
      unaff_R14 = (uv_process_options_t *)(long)*piVar6;
    }
    puStack_f8 = (uv_process_options_t *)0x0;
    apuStack_f0[0] = unaff_R14;
    if (unaff_R14 != (uv_process_options_t *)0x0) goto LAB_001c28c8;
    unaff_RBX = (uv_process_options_t *)(ulong)uVar3;
    puVar4 = (uv_process_options_t *)0x0;
    do {
      if ((puVar4 < (uv_process_options_t *)0x400) &&
         (puVar7 = puVar4, (cStack_d8.__bits[(ulong)puVar4 >> 6] >> ((ulong)puVar4 & 0x3f) & 1) != 0
         )) break;
      puVar4 = (uv_process_options_t *)((long)&puVar4->exit_cb + 1);
      puVar7 = unaff_RBX;
    } while (unaff_RBX != puVar4);
    unaff_R15 = (uv_process_options_t *)((ulong)puVar7 & 0xffffffff);
    puStack_f8 = unaff_RBX;
    apuStack_f0[0] = unaff_R15;
    if (unaff_RBX <= unaff_R15) goto LAB_001c28d5;
    puStack_100 = (uv_process_options_t *)0x1c27a8;
    snprintf((char *)apuStack_f0,0xb,"%d",unaff_R15);
    puStack_100 = (uv_process_options_t *)0x1c27bb;
    init_process_options("spawn_helper_affinity",exit_cb);
    puStack_100 = (uv_process_options_t *)0x1c27c8;
    puVar7 = (uv_process_options_t *)calloc((size_t)unaff_RBX,1);
    puVar4 = unaff_RBX;
    if (puVar7 == (uv_process_options_t *)0x0) goto LAB_001c28e2;
    *(char *)((long)&unaff_R15->exit_cb + (long)&puVar7->exit_cb) = '\x01';
    puVar4 = &options;
    options.cpumask = (char *)puVar7;
    options.cpumask_size = (size_t)unaff_RBX;
    options.args[2] = (char *)apuStack_f0;
    options.args[3] = "dummy";
    puStack_100 = (uv_process_options_t *)0x1c2810;
    uVar5 = uv_default_loop();
    puStack_100 = (uv_process_options_t *)0x1c2822;
    iVar2 = uv_spawn(uVar5,&process,&options);
    if (iVar2 != 0) goto LAB_001c28e7;
    puStack_100 = (uv_process_options_t *)0x1c282f;
    uVar5 = uv_default_loop();
    puStack_100 = (uv_process_options_t *)0x1c2839;
    iVar2 = uv_run(uVar5,0);
    if (iVar2 != 0) goto LAB_001c28ec;
    if (exit_cb_called != 1) goto LAB_001c28f1;
    if (close_cb_called != 1) goto LAB_001c28f6;
    puStack_100 = (uv_process_options_t *)0x1c2863;
    free(puVar7);
    puStack_100 = (uv_process_options_t *)0x1c2868;
    puVar4 = (uv_process_options_t *)uv_default_loop();
    puStack_100 = (uv_process_options_t *)0x1c287c;
    uv_walk(puVar4,close_walk_cb,0);
    puStack_100 = (uv_process_options_t *)0x1c2886;
    uv_run(puVar4,0);
    puStack_f8 = (uv_process_options_t *)0x0;
    puStack_100 = (uv_process_options_t *)0x1c2893;
    uVar5 = uv_default_loop();
    puStack_100 = (uv_process_options_t *)0x1c289b;
    iVar2 = uv_loop_close(uVar5);
    puStack_e0 = (uv_process_options_t *)(long)iVar2;
    if (puStack_f8 == puStack_e0) {
      puStack_100 = (uv_process_options_t *)0x1c28b2;
      uv_library_shutdown();
      return 0;
    }
  }
  puStack_100 = (uv_process_options_t *)run_test_spawn_affinity_invalid_mask;
  run_test_spawn_affinity_cold_8();
  puStack_128 = (uv_process_options_t *)0x1c2912;
  puStack_100 = puVar4;
  iVar2 = uv_cpumask_size();
  if (iVar2 < 1) {
    puStack_128 = (uv_process_options_t *)0x1c29d1;
    run_test_spawn_affinity_invalid_mask_cold_1();
LAB_001c29d1:
    puStack_128 = (uv_process_options_t *)0x1c29d6;
    run_test_spawn_affinity_invalid_mask_cold_2();
LAB_001c29d6:
    puStack_128 = (uv_process_options_t *)0x1c29db;
    run_test_spawn_affinity_invalid_mask_cold_3();
  }
  else {
    puStack_128 = (uv_process_options_t *)0x1c292d;
    init_process_options("",exit_cb);
    options.cpumask = &cStack_111;
    cStack_111 = '\0';
    options.cpumask_size = 0;
    puVar4 = &options;
    puStack_128 = (uv_process_options_t *)0x1c2953;
    uVar5 = uv_default_loop();
    puStack_128 = (uv_process_options_t *)0x1c2965;
    iVar2 = uv_spawn(uVar5,&process,&options);
    if (iVar2 != -0x16) goto LAB_001c29d1;
    if (exit_cb_called != 0) goto LAB_001c29d6;
    puStack_128 = (uv_process_options_t *)0x1c2978;
    puVar4 = (uv_process_options_t *)uv_default_loop();
    puStack_128 = (uv_process_options_t *)0x1c298c;
    uv_walk(puVar4,close_walk_cb,0);
    puStack_128 = (uv_process_options_t *)0x1c2996;
    uv_run(puVar4,0);
    lStack_108 = 0;
    puStack_128 = (uv_process_options_t *)0x1c29a4;
    uVar5 = uv_default_loop();
    puStack_128 = (uv_process_options_t *)0x1c29ac;
    iVar2 = uv_loop_close(uVar5);
    lStack_110 = (long)iVar2;
    if (lStack_108 == lStack_110) {
      puStack_128 = (uv_process_options_t *)0x1c29c4;
      uv_library_shutdown();
      return 0;
    }
  }
  puStack_128 = (uv_process_options_t *)run_test_spawn_auto_unref;
  run_test_spawn_affinity_invalid_mask_cold_4();
  puStack_140 = (uv_process_options_t *)0x1c29fd;
  puStack_128 = puVar4;
  init_process_options("spawn_helper1",(uv_exit_cb)0x0);
  puStack_140 = (uv_process_options_t *)0x1c2a02;
  uVar5 = uv_default_loop();
  puStack_140 = (uv_process_options_t *)0x1c2a18;
  iVar2 = uv_spawn(uVar5,&process,&options);
  lStack_130 = (long)iVar2;
  lStack_138 = 0;
  if (lStack_130 == 0) {
    puStack_140 = (uv_process_options_t *)0x1c2a3b;
    uVar5 = uv_default_loop();
    puStack_140 = (uv_process_options_t *)0x1c2a45;
    iVar2 = uv_run(uVar5,0);
    lStack_130 = (long)iVar2;
    lStack_138 = 0;
    if (lStack_130 != 0) goto LAB_001c2b56;
    puStack_140 = (uv_process_options_t *)0x1c2a6f;
    iVar2 = uv_is_closing(&process);
    lStack_130 = (long)iVar2;
    lStack_138 = 0;
    if (lStack_130 != 0) goto LAB_001c2b63;
    puStack_140 = (uv_process_options_t *)0x1c2a9b;
    uv_close(&process,0);
    puStack_140 = (uv_process_options_t *)0x1c2aa0;
    uVar5 = uv_default_loop();
    puStack_140 = (uv_process_options_t *)0x1c2aaa;
    iVar2 = uv_run(uVar5,0);
    lStack_130 = (long)iVar2;
    lStack_138 = 0;
    if (lStack_130 != 0) goto LAB_001c2b70;
    lStack_130 = 1;
    puStack_140 = (uv_process_options_t *)0x1c2add;
    iVar2 = uv_is_closing(&process);
    lStack_138 = (long)iVar2;
    if (lStack_130 != lStack_138) goto LAB_001c2b7d;
    puStack_140 = (uv_process_options_t *)0x1c2af7;
    puVar4 = (uv_process_options_t *)uv_default_loop();
    puStack_140 = (uv_process_options_t *)0x1c2b0b;
    uv_walk(puVar4,close_walk_cb,0);
    puStack_140 = (uv_process_options_t *)0x1c2b15;
    uv_run(puVar4,0);
    lStack_130 = 0;
    puStack_140 = (uv_process_options_t *)0x1c2b23;
    uVar5 = uv_default_loop();
    puStack_140 = (uv_process_options_t *)0x1c2b2b;
    iVar2 = uv_loop_close(uVar5);
    lStack_138 = (long)iVar2;
    if (lStack_130 == lStack_138) {
      puStack_140 = (uv_process_options_t *)0x1c2b41;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_140 = (uv_process_options_t *)0x1c2b56;
    run_test_spawn_auto_unref_cold_1();
LAB_001c2b56:
    puStack_140 = (uv_process_options_t *)0x1c2b63;
    run_test_spawn_auto_unref_cold_2();
LAB_001c2b63:
    puStack_140 = (uv_process_options_t *)0x1c2b70;
    run_test_spawn_auto_unref_cold_3();
LAB_001c2b70:
    puStack_140 = (uv_process_options_t *)0x1c2b7d;
    run_test_spawn_auto_unref_cold_4();
LAB_001c2b7d:
    puStack_140 = (uv_process_options_t *)0x1c2b8a;
    run_test_spawn_auto_unref_cold_5();
  }
  puStack_140 = (uv_process_options_t *)run_test_spawn_fs_open;
  run_test_spawn_auto_unref_cold_6();
  uStack_5b0 = 0x6c756e2f7665642f;
  uStack_5a8 = 0x6c;
  puStack_150 = puVar4;
  puStack_148 = puVar7;
  puStack_140 = unaff_R15;
  iVar2 = uv_fs_open(0,auStack_310,&uStack_5b0,2,0,0);
  alStack_3f8[0] = (long)iVar2;
  alStack_4c0[0] = 0;
  if (alStack_3f8[0] == 0) {
    puVar4 = (uv_process_options_t *)(ulong)uStack_2b8;
    uStack_5c8 = uStack_2b8;
    init_process_options("spawn_helper8",exit_cb);
    uVar5 = uv_default_loop();
    iVar2 = uv_pipe_init(uVar5,(uv_stream_t *)alStack_3f8,0);
    alStack_4c0[0] = (long)iVar2;
    alStack_588[0] = 0;
    if (alStack_4c0[0] != 0) goto LAB_001c2eb0;
    options.stdio = &uStack_5a0;
    uStack_5a0.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
    options.stdio_count = 1;
    uStack_5a0.data.stream = (uv_stream_t *)alStack_3f8;
    iStack_5c4 = dup(uStack_2b8);
    uVar5 = uv_default_loop();
    iVar2 = uv_spawn(uVar5,&process,&options);
    alStack_4c0[0] = (long)iVar2;
    alStack_588[0] = 0;
    if (alStack_4c0[0] != 0) goto LAB_001c2ec2;
    auStack_5c0 = uv_buf_init(&uStack_5c8,4);
    iVar2 = uv_write(alStack_4c0,alStack_3f8,auStack_5c0,1,write_null_cb);
    alStack_588[0] = (long)iVar2;
    if (alStack_588[0] != 0) goto LAB_001c2ed4;
    auVar8 = uv_buf_init(&iStack_5c4,4);
    auStack_5c0 = auVar8;
    iVar2 = uv_write(alStack_588,alStack_3f8,auStack_5c0,1,write_cb);
    lStack_5d0 = 0;
    if (iVar2 != 0) goto LAB_001c2ee3;
    uVar5 = uv_default_loop();
    iVar2 = uv_run(uVar5,0);
    lStack_5d0 = 0;
    if (iVar2 != 0) goto LAB_001c2ef2;
    iVar2 = uv_fs_close(0,auStack_310,uStack_5c8,0);
    lStack_5d0 = 0;
    if (iVar2 != 0) goto LAB_001c2f01;
    lStack_5d0 = (long)exit_cb_called;
    if (lStack_5d0 != 1) goto LAB_001c2f10;
    lStack_5d0 = (long)close_cb_called;
    if (lStack_5d0 != 2) goto LAB_001c2f1f;
    puVar4 = (uv_process_options_t *)uv_default_loop();
    uv_walk(puVar4,close_walk_cb,0);
    uv_run(puVar4,0);
    uVar5 = uv_default_loop();
    iVar2 = uv_loop_close(uVar5);
    lStack_5d0 = (long)iVar2;
    if (lStack_5d0 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_fs_open_cold_1();
LAB_001c2eb0:
    run_test_spawn_fs_open_cold_2();
LAB_001c2ec2:
    run_test_spawn_fs_open_cold_3();
LAB_001c2ed4:
    run_test_spawn_fs_open_cold_4();
LAB_001c2ee3:
    run_test_spawn_fs_open_cold_5();
LAB_001c2ef2:
    run_test_spawn_fs_open_cold_6();
LAB_001c2f01:
    run_test_spawn_fs_open_cold_7();
LAB_001c2f10:
    run_test_spawn_fs_open_cold_8();
LAB_001c2f1f:
    run_test_spawn_fs_open_cold_9();
  }
  iVar2 = (int)&lStack_5d0;
  run_test_spawn_fs_open_cold_10();
  if (iVar2 == 0) {
    return 0;
  }
  write_null_cb_cold_1();
  puStack_608 = puVar4;
  auStack_918._24_16_ = uv_buf_init("",1);
  iVar2 = uv_pipe(auStack_918 + 0x10,0,0);
  if (iVar2 == 0) {
    init_process_options("spawn_helper4",exit_cb);
    options.stdio_count = 3;
    options.stdio = &uStack_640;
    uStack_640.flags = UV_INHERIT_FD;
    uStack_640.data.file = auStack_918._16_4_;
    uStack_630 = 0;
    uStack_620 = 0;
    uVar5 = uv_default_loop();
    iVar2 = uv_spawn(uVar5,&process,&options);
    apuStack_8e8[0] = (uv_handle_t *)(long)iVar2;
    auStack_728[0] = 0;
    if (apuStack_8e8[0] != (uv_handle_t *)0x0) goto LAB_001c33eb;
    uv_unref(&process);
    uVar5 = uv_default_loop();
    iVar2 = uv_pipe_init(uVar5,auStack_728,0);
    apuStack_8e8[0] = (uv_handle_t *)(long)iVar2;
    auStack_918._0_8_ = (uv_loop_t *)0x0;
    if (apuStack_8e8[0] != (uv_handle_t *)0x0) goto LAB_001c33fd;
    iVar2 = uv_pipe_open(auStack_728,auStack_918._16_4_);
    apuStack_8e8[0] = (uv_handle_t *)(long)iVar2;
    auStack_918._0_8_ = (uv_loop_t *)0x0;
    if (apuStack_8e8[0] != (uv_handle_t *)0x0) goto LAB_001c340c;
    auStack_918._16_4_ = ~UV_UNKNOWN_HANDLE;
    iVar2 = uv_read_start(auStack_728,on_alloc,on_read_once);
    apuStack_8e8[0] = (uv_handle_t *)(long)iVar2;
    auStack_918._0_8_ = (uv_loop_t *)0x0;
    if (apuStack_8e8[0] != (uv_handle_t *)0x0) goto LAB_001c341b;
    auStack_918._0_8_ = (uv_loop_t *)0x1;
    iVar2 = uv_fs_write(0,apuStack_8e8,auStack_918._20_4_,auStack_918 + 0x18,1,0xffffffffffffffff,0)
    ;
    auStack_918._8_8_ = SEXT48(iVar2);
    if (auStack_918._0_8_ != auStack_918._8_8_) goto LAB_001c342a;
    auStack_918._0_8_ = (uv_loop_t *)0x1;
    auStack_918._8_8_ = puStack_890;
    if (puStack_890 != (uv_loop_t *)0x1) goto LAB_001c3439;
    uv_fs_req_cleanup(apuStack_8e8);
    uVar5 = uv_default_loop();
    iVar2 = uv_run(uVar5,1);
    auStack_918._0_8_ = SEXT48(iVar2);
    auStack_918._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_918._0_8_ != (uv_loop_t *)0x0) goto LAB_001c3448;
    auStack_918._0_8_ = (uv_loop_t *)0x1;
    auStack_918._8_8_ = SEXT48(output_used);
    if ((uv_loop_t *)auStack_918._8_8_ != (uv_loop_t *)0x1) goto LAB_001c3457;
    uv_close(auStack_728,close_cb);
    auStack_918._0_8_ = (uv_loop_t *)0x1;
    iVar2 = uv_fs_write(0,apuStack_8e8,auStack_918._20_4_,auStack_918 + 0x18,1,0xffffffffffffffff,0)
    ;
    auStack_918._8_8_ = SEXT48(iVar2);
    if (auStack_918._0_8_ != auStack_918._8_8_) goto LAB_001c3466;
    auStack_918._0_8_ = (uv_loop_t *)0x1;
    auStack_918._8_8_ = puStack_890;
    if (puStack_890 != (uv_loop_t *)0x1) goto LAB_001c3475;
    uv_fs_req_cleanup(apuStack_8e8);
    uVar5 = uv_default_loop();
    iVar2 = uv_timer_init(uVar5,&timer);
    auStack_918._0_8_ = SEXT48(iVar2);
    auStack_918._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_918._0_8_ != (uv_loop_t *)0x0) goto LAB_001c3484;
    iVar2 = uv_timer_start(&timer,timer_counter_cb,10,0);
    auStack_918._0_8_ = SEXT48(iVar2);
    auStack_918._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_918._0_8_ != (uv_loop_t *)0x0) goto LAB_001c3493;
    uVar5 = uv_default_loop();
    iVar2 = uv_run(uVar5,1);
    if (iVar2 == 1) {
      uVar5 = uv_default_loop();
      iVar2 = uv_run(uVar5,1);
      auStack_918._0_8_ = SEXT48(iVar2);
      auStack_918._8_8_ = (uv_loop_t *)0x0;
      if ((uv_loop_t *)auStack_918._0_8_ != (uv_loop_t *)0x0) goto LAB_001c34de;
    }
    auStack_918._0_8_ = (uv_loop_t *)0x1;
    auStack_918._8_8_ = SEXT48(timer_counter);
    if ((uv_loop_t *)auStack_918._8_8_ != (uv_loop_t *)0x1) goto LAB_001c34a2;
    iVar2 = uv_process_kill(&process,0xf);
    auStack_918._0_8_ = SEXT48(iVar2);
    auStack_918._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_918._0_8_ != (uv_loop_t *)0x0) goto LAB_001c34b1;
    iVar2 = close(auStack_918._20_4_);
    auStack_918._0_8_ = SEXT48(iVar2);
    auStack_918._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_918._0_8_ != (uv_loop_t *)0x0) goto LAB_001c34c0;
    auStack_918._20_4_ = -1;
    uVar5 = uv_default_loop();
    uv_walk(uVar5,close_walk_cb,0);
    uv_run(uVar5,0);
    auStack_918._0_8_ = (uv_loop_t *)0x0;
    uVar5 = uv_default_loop();
    iVar2 = uv_loop_close(uVar5);
    auStack_918._8_8_ = SEXT48(iVar2);
    if (auStack_918._0_8_ == auStack_918._8_8_) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_closed_fd_events_cold_1();
LAB_001c33eb:
    run_test_closed_fd_events_cold_2();
LAB_001c33fd:
    run_test_closed_fd_events_cold_3();
LAB_001c340c:
    run_test_closed_fd_events_cold_4();
LAB_001c341b:
    run_test_closed_fd_events_cold_5();
LAB_001c342a:
    run_test_closed_fd_events_cold_6();
LAB_001c3439:
    run_test_closed_fd_events_cold_7();
LAB_001c3448:
    run_test_closed_fd_events_cold_8();
LAB_001c3457:
    run_test_closed_fd_events_cold_9();
LAB_001c3466:
    run_test_closed_fd_events_cold_10();
LAB_001c3475:
    run_test_closed_fd_events_cold_11();
LAB_001c3484:
    run_test_closed_fd_events_cold_12();
LAB_001c3493:
    run_test_closed_fd_events_cold_13();
LAB_001c34a2:
    run_test_closed_fd_events_cold_15();
LAB_001c34b1:
    run_test_closed_fd_events_cold_16();
LAB_001c34c0:
    run_test_closed_fd_events_cold_17();
  }
  run_test_closed_fd_events_cold_18();
LAB_001c34de:
  tcp = (uv_stream_t *)auStack_918;
  nread = auStack_918 + 8;
  run_test_closed_fd_events_cold_14();
  uv_read_stop();
  on_read(tcp,(ssize_t)nread,buf);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(spawn_setuid_fails) {
  int r;

  /* if root, become nobody. */
  /* On IBMi PASE, there is no nobody user. */
#ifndef __PASE__
  uv_uid_t uid = getuid();
  if (uid == 0) {
    struct passwd* pw;
    pw = getpwnam("nobody");
    ASSERT_NOT_NULL(pw);
    ASSERT_OK(setgid(pw->pw_gid));
    ASSERT_OK(setuid(pw->pw_uid));
  }
#endif  /* !__PASE__ */

  init_process_options("spawn_helper1", fail_cb);

  options.flags |= UV_PROCESS_SETUID;
  /* On IBMi PASE, there is no root user. User may grant 
   * root-like privileges, including setting uid to 0.
   */
#if defined(__PASE__)
  options.uid = -1;
#else
  options.uid = 0;
#endif

  /* These flags should be ignored on Unices. */
  options.flags |= UV_PROCESS_WINDOWS_HIDE;
  options.flags |= UV_PROCESS_WINDOWS_HIDE_CONSOLE;
  options.flags |= UV_PROCESS_WINDOWS_HIDE_GUI;
  options.flags |= UV_PROCESS_WINDOWS_VERBATIM_ARGUMENTS;

  r = uv_spawn(uv_default_loop(), &process, &options);
#if defined(__CYGWIN__)
  ASSERT_EQ(r, UV_EINVAL);
#else
  ASSERT_EQ(r, UV_EPERM);
#endif

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_OK(close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}